

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommon.cpp
# Opt level: O0

void __thiscall ODDLParser::Reference::Reference(Reference *this,size_t numrefs,Name **names)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  Name **ppNVar3;
  ulong local_28;
  size_t i;
  Name **names_local;
  size_t numrefs_local;
  Reference *this_local;
  
  this->m_numRefs = numrefs;
  this->m_referencedName = (Name **)0x0;
  if (numrefs != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = numrefs;
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    ppNVar3 = (Name **)operator_new__(uVar2);
    this->m_referencedName = ppNVar3;
    for (local_28 = 0; local_28 < numrefs; local_28 = local_28 + 1) {
      this->m_referencedName[local_28] = names[local_28];
    }
  }
  return;
}

Assistant:

Reference::Reference( size_t numrefs, Name **names )
: m_numRefs( numrefs )
, m_referencedName( ddl_nullptr ) {
    if ( numrefs > 0 ) {
        m_referencedName = new Name *[ numrefs ];
        for ( size_t i = 0; i < numrefs; i++ ) {
            m_referencedName[ i ] = names[i];
        }
    }
}